

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

void __thiscall Catch::RedirectedStreams::~RedirectedStreams(RedirectedStreams *this)

{
  string local_50;
  string local_30;
  RedirectedStreams *local_10;
  RedirectedStreams *this_local;
  
  local_10 = this;
  RedirectedStdOut::str_abi_cxx11_(&local_30,&this->m_redirectedStdOut);
  std::__cxx11::string::operator+=((string *)this->m_redirectedCout,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  RedirectedStdErr::str_abi_cxx11_(&local_50,&this->m_redirectedStdErr);
  std::__cxx11::string::operator+=((string *)this->m_redirectedCerr,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  RedirectedStdErr::~RedirectedStdErr(&this->m_redirectedStdErr);
  RedirectedStdOut::~RedirectedStdOut(&this->m_redirectedStdOut);
  return;
}

Assistant:

RedirectedStreams::~RedirectedStreams() {
        m_redirectedCout += m_redirectedStdOut.str();
        m_redirectedCerr += m_redirectedStdErr.str();
    }